

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_DropInventory
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  PClassActor *type;
  bool bVar1;
  AInventory *item;
  AActor *this;
  char *pcVar2;
  
  if (numparam < 1) {
    pcVar2 = "(paramnum) < numparam";
    goto LAB_003e5680;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003e5667:
    pcVar2 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003e5680:
    __assert_fail(pcVar2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xe43,
                  "int AF_AActor_A_DropInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  this = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (this == (AActor *)0x0) goto LAB_003e5604;
    bVar1 = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
    if (!bVar1) {
      pcVar2 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003e5680;
    }
  }
  else {
    if (this != (AActor *)0x0) goto LAB_003e5667;
LAB_003e5604:
    this = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar2 = "(paramnum) < numparam";
  }
  else {
    if (param[1].field_0.field_3.Type == '\x03') {
      type = (PClassActor *)param[1].field_0.field_1.a;
      if (param[1].field_0.field_1.atag == 1) {
        if (type != (PClassActor *)0x0) {
          bVar1 = PClass::IsAncestorOf(AInventory::RegistrationInfo.MyClass,(PClass *)type);
          if (!bVar1) {
            pcVar2 = "drop == NULL || drop->IsDescendantOf(RUNTIME_CLASS(AInventory))";
            goto LAB_003e56a8;
          }
          item = AActor::FindInventory(this,type,false);
          if (item != (AInventory *)0x0) {
            AActor::DropInventory(this,item);
          }
        }
        return 0;
      }
      if (type == (PClassActor *)0x0) {
        return 0;
      }
    }
    pcVar2 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003e56a8:
  __assert_fail(pcVar2,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0xe44,
                "int AF_AActor_A_DropInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_DropInventory)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_CLASS(drop, AInventory);

	if (drop)
	{
		AInventory *inv = self->FindInventory(drop);
		if (inv)
		{
			self->DropInventory(inv);
		}
	}
	return 0;
}